

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O3

int __thiscall
GEO::geofile::rotate_data
          (geofile *this,double *o_x,double *o_y,double *o_z,double *theta_x,double *theta_y,
          double *theta_z)

{
  geofile *pgVar1;
  _Self __tmp;
  geofile *this_00;
  geofile *pgVar2;
  bool local_39;
  double *local_38;
  
  local_39 = true;
  local_38 = theta_y;
  make_coherent(this,&local_39);
  this_00 = this;
  simplify_data(this);
  pgVar1 = (geofile *)(this->points_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (pgVar2 = pgVar1,
        pgVar2 != (geofile *)&(this->points_map)._M_t._M_impl.super__Rb_tree_header) {
    rotate_point(this_00,o_x,o_y,o_z,theta_x,local_38,theta_z,
                 (point *)&(pgVar2->points_map)._M_t._M_impl.super__Rb_tree_header._M_header.
                           _M_parent);
    pgVar1 = (geofile *)std::_Rb_tree_increment((_Rb_tree_node_base *)pgVar2);
    this_00 = pgVar2;
  }
  return 0;
}

Assistant:

int GEO::geofile::rotate_data( const double &o_x,      const double &o_y,
                                const double &o_z,      const double &theta_x,
                                const double &theta_y,  const double &theta_z)
{
    make_coherent(true);
    simplify_data();
    auto pm_end = points_map.end();
    for (auto i = points_map.begin(); i != pm_end; i++)
    {
        rotate_point(o_x,o_y,o_z,theta_x,theta_y,theta_z,i->second);
    }
    return EXIT_SUCCESS;
}